

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::createProgram(FunctionalTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  uint local_60;
  uint local_5c;
  GLuint i_2;
  GLuint i_1;
  GLint status;
  GLint status_1;
  GLuint i;
  undefined4 local_3c;
  undefined4 uStack_38;
  GLuint shader_count;
  Shader shader [2];
  Functions *gl;
  FunctionalTest *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  shader[1]._8_8_ = CONCAT44(extraout_var,iVar1);
  shader[0]._8_8_ = s_fragment_shader;
  shader[1].source = (GLchar *)0x8b30;
  uStack_38 = 0x29ed800;
  shader_count = 0;
  shader[0].source._0_4_ = 0x8b31;
  shader[0].source._4_4_ = 0;
  local_3c = 2;
  GVar2 = (**(code **)(shader[1]._8_8_ + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x17a);
  status = 0;
  do {
    if (1 < (uint)status) {
      (**(code **)(shader[1]._8_8_ + 0xce8))(this->m_po_id);
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glTransformFeedbackVaryings call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x1a1);
      i_2 = 0;
      (**(code **)(shader[1]._8_8_ + 0x9d8))(this->m_po_id,0x8b82,&i_2);
      if (i_2 != 1) {
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
      for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
        if (*(int *)((long)&shader[local_5c].source + 4) != 0) {
          (**(code **)(shader[1]._8_8_ + 0x4e0))
                    (this->m_po_id,*(undefined4 *)((long)&shader[local_5c].source + 4));
          dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
          glu::checkError(dVar3,"glDetachShader call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                          ,0x1af);
        }
      }
      for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
        if (*(int *)((long)&shader[local_60].source + 4) != 0) {
          (**(code **)(shader[1]._8_8_ + 0x470))
                    (*(undefined4 *)((long)&shader[local_60].source + 4));
          *(undefined4 *)((long)&shader[local_60].source + 4) = 0;
        }
      }
      if (this->m_po_id != 0) {
        (**(code **)(shader[1]._8_8_ + 0x1680))(this->m_po_id);
        dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
        glu::checkError(dVar3,"glUseProgram call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                        ,0x1d0);
      }
      return;
    }
    if (*(long *)((long)&stack0xffffffffffffffc8 + (ulong)(uint)status * 0x10) != 0) {
      uVar4 = (**(code **)(shader[1]._8_8_ + 0x3f0))(*(undefined4 *)&shader[(uint)status].source);
      *(undefined4 *)((long)&shader[(uint)status].source + 4) = uVar4;
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x184);
      (**(code **)(shader[1]._8_8_ + 0x10))
                (this->m_po_id,*(undefined4 *)((long)&shader[(uint)status].source + 4));
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x188);
      (**(code **)(shader[1]._8_8_ + 0x12b8))
                (*(undefined4 *)((long)&shader[(uint)status].source + 4),1,
                 (undefined1 *)((long)&stack0xffffffffffffffc8 + (ulong)(uint)status * 0x10),0);
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x18c);
      (**(code **)(shader[1]._8_8_ + 0x248))
                (*(undefined4 *)((long)&shader[(uint)status].source + 4));
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,400);
      i_1 = 0;
      (**(code **)(shader[1]._8_8_ + 0xa70))
                (*(undefined4 *)((long)&shader[(uint)status].source + 4),0x8b81,&i_1);
      dVar3 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x195);
      if (i_1 == 0) {
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
    }
    status = status + 1;
  } while( true );
}

Assistant:

void gl4cts::ConditionalRenderInverted::FunctionalTest::createProgram()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { s_vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po_id, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po_id, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			throw 0;
		}
	}
	catch (...)
	{
		if (m_po_id)
		{
			gl.deleteProgram(m_po_id);

			m_po_id = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (m_po_id)
	{
		gl.useProgram(m_po_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");
	}
}